

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEdit.cpp
# Opt level: O0

QPoint __thiscall GraphEdit::mouseToPlotCoordinates(GraphEdit *this,QPoint mouse)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  bool bVar5;
  int range;
  bool aboveTop;
  int iStack_24;
  bool belowBottom;
  int y;
  int x;
  GraphEdit *this_local;
  QPoint mouse_local;
  
  _y = this;
  this_local = (GraphEdit *)mouse;
  iVar2 = QPoint::x((QPoint *)&this_local);
  iVar3 = QRect::right(&this->mPlotRect);
  if (iVar2 < iVar3) {
    iVar2 = QPoint::x((QPoint *)&this_local);
    iVar3 = QRect::left(&this->mPlotRect);
    if (iVar2 < iVar3) {
      iStack_24 = 0;
    }
    else {
      iVar2 = QPoint::x((QPoint *)&this_local);
      iVar3 = QRect::left(&this->mPlotRect);
      iStack_24 = (iVar2 - iVar3) / this->mCellWidth;
    }
  }
  else {
    iVar2 = QRect::width(&this->mPlotRect);
    iStack_24 = iVar2 / this->mCellWidth + -1;
  }
  iVar2 = QRect::bottom(&this->mPlotRect);
  iVar3 = QPoint::y((QPoint *)&this_local);
  range = iVar2 - iVar3;
  bVar5 = -1 < range;
  iVar2 = QRect::top(&this->mPlotRect);
  iVar3 = QPoint::y((QPoint *)&this_local);
  if ((this->mBarMode & 1U) == 0) {
    if (bVar5) {
      if (iVar2 < iVar3) {
        range = range / this->mCellHeight;
      }
      else {
        iVar2 = QRect::height(&this->mPlotRect);
        range = (iVar2 + -1) / this->mCellHeight;
      }
    }
    else {
      range = 0;
    }
  }
  else if (bVar5) {
    if (iVar2 < iVar3) {
      iVar3 = this->mMaxValue - this->mMinValue;
      iVar2 = QRect::height(&this->mPlotRect);
      uVar1 = (long)iVar2 / (long)iVar3;
      range = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / 2) +
              range;
      iVar3 = range * iVar3;
      iVar2 = QRect::height(&this->mPlotRect);
      range = iVar3 / iVar2 + this->mMinValue;
      piVar4 = std::clamp<int>(&range,&this->mMinValue,&this->mMaxValue);
      range = *piVar4;
    }
    else {
      range = this->mMaxValue;
    }
  }
  else {
    range = this->mMinValue;
  }
  QPoint::QPoint(&mouse_local,iStack_24,range);
  return mouse_local;
}

Assistant:

QPoint GraphEdit::mouseToPlotCoordinates(QPoint mouse) {

    int x;
    if (mouse.x() >= mPlotRect.right()) {
        x = (mPlotRect.width() / mCellWidth) - 1;
    } else if (mouse.x() < mPlotRect.left()) {
        x = 0;
    } else {
        x = (mouse.x() - mPlotRect.left()) / mCellWidth;
    }

    auto y = mPlotRect.bottom() - mouse.y();
    bool const belowBottom = y < 0;
    bool const aboveTop = mPlotRect.top() >= mouse.y();
    
    if (mBarMode) {
        if (belowBottom) {
            y = mMinValue;
        } else if (aboveTop) {
            y = mMaxValue;
        } else {
            auto range = mMaxValue - mMinValue;
            y += mPlotRect.height() / range / 2;
            y = y * range / mPlotRect.height() + mMinValue;
            y = std::clamp(y, mMinValue, mMaxValue);
        }
    } else {
        if (belowBottom) {
            y = 0;
        } else if (aboveTop) {
            y = (mPlotRect.height() - 1) / mCellHeight;
        } else {
            y = y / mCellHeight;
        }
    }

    return {x, y};
}